

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O2

void __thiscall CDirectiveAlignFill::writeTempData(CDirectiveAlignFill *this,TempData *tempData)

{
  int iVar1;
  int64_t iVar2;
  char *in_R8;
  string sStack_38;
  
  iVar1 = *(int *)&(this->super_CAssemblerCommand).field_0x14;
  if (iVar1 == 0) {
    iVar2 = this->virtualAddress;
    tinyformat::format<long>(&sStack_38,".aligna 0x%08X",&this->value);
    TempData::writeLine(tempData,iVar2,&sStack_38);
  }
  else if (iVar1 == 2) {
    iVar2 = this->virtualAddress;
    tinyformat::format<long,signed_char>
              (&sStack_38,(tinyformat *)".fill 0x%08X,0x%02X",(char *)&this->value,
               (long *)&this->fillByte,in_R8);
    TempData::writeLine(tempData,iVar2,&sStack_38);
  }
  else {
    if (iVar1 != 1) {
      return;
    }
    iVar2 = this->virtualAddress;
    tinyformat::format<long>(&sStack_38,".align 0x%08X",&this->value);
    TempData::writeLine(tempData,iVar2,&sStack_38);
  }
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void CDirectiveAlignFill::writeTempData(TempData& tempData) const
{
	switch (mode)
	{
	case AlignVirtual:
		tempData.writeLine(virtualAddress,tfm::format(".align 0x%08X",value));
		break;
	case AlignPhysical:
		tempData.writeLine(virtualAddress, tfm::format(".aligna 0x%08X", value));
		break;
	case Fill:
		tempData.writeLine(virtualAddress,tfm::format(".fill 0x%08X,0x%02X",value,fillByte));
		break;
	}
}